

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlf.h
# Opt level: O1

void __thiscall TLF<4U>::Init(TLF<4U> *this,Data<4U> *from,Data<4U> *to)

{
  uint uVar1;
  iterator iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  Stream<4U> stream;
  key_type local_20;
  
  auVar6 = in_ZMM0._0_16_;
  local_20.str._0_4_ = *(undefined4 *)from->str;
  local_20.str._4_4_ = *(undefined4 *)to->str;
  uVar1 = Hash::BOBHash32(local_20.str,8,0);
  auVar6 = vcvtusi2sd_avx512f(auVar6,uVar1);
  if (this->epsilon <= auVar6._0_8_ / 4294967295.0) {
    return;
  }
  iVar2 = std::
          _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->ip)._M_h,from);
  if (iVar2.super__Node_iterator_base<std::pair<const_Data<4U>,_int>,_true>._M_cur ==
      (__node_type *)0x0) {
    pmVar5 = std::__detail::
             _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->ip,from);
  }
  else {
    iVar3 = std::
            _Hashtable<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->sp)._M_h,&local_20);
    if (iVar3.super__Node_iterator_base<std::pair<const_Stream<4U>,_int>,_true>._M_cur !=
        (__node_type *)0x0) {
      return;
    }
    pmVar4 = std::__detail::
             _Map_base<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->sp,&local_20);
    *pmVar4 = 1;
    iVar2 = std::
            _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->mp)._M_h,from);
    pmVar5 = std::__detail::
             _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->mp,from);
    if (iVar2.super__Node_iterator_base<std::pair<const_Data<4U>,_int>,_true>._M_cur !=
        (__node_type *)0x0) {
      *pmVar5 = *pmVar5 + 1;
      return;
    }
  }
  *pmVar5 = 1;
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& from, const Data<DATA_LEN>& to) {
		uint Max = 0xffffffff;
		Stream<DATA_LEN> stream(from, to);
		if (stream.Hash() / (double)Max < epsilon) {
			if (ip.find(from) != ip.end()) {
				if (sp.find(stream) == sp.end()) {
					sp[stream] = 1;
					if (mp.find(from) == mp.end())
						mp[from] = 1;
					else
						mp[from] += 1;
				}
			}
			else {
				ip[from] = 1;
			}
		}
	}